

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_graph_get_tensor(ggml_cgraph *cgraph,char *name)

{
  ggml_tensor *pgVar1;
  int iVar2;
  char *in_RSI;
  long in_RDI;
  ggml_tensor *node;
  int i_1;
  ggml_tensor *leaf;
  int i;
  int local_2c;
  int local_1c;
  
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
    pgVar1 = *(ggml_tensor **)(*(long *)(in_RDI + 0x28) + (long)local_1c * 8);
    iVar2 = strcmp(pgVar1->name,in_RSI);
    if (iVar2 == 0) {
      return pgVar1;
    }
  }
  local_2c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 4) <= local_2c) {
      return (ggml_tensor *)0x0;
    }
    pgVar1 = *(ggml_tensor **)(*(long *)(in_RDI + 0x10) + (long)local_2c * 8);
    iVar2 = strcmp(pgVar1->name,in_RSI);
    if (iVar2 == 0) break;
    local_2c = local_2c + 1;
  }
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_graph_get_tensor(const struct ggml_cgraph * cgraph, const char * name) {
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * leaf = cgraph->leafs[i];

        if (strcmp(leaf->name, name) == 0) {
            return leaf;
        }
    }

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (strcmp(node->name, name) == 0) {
            return node;
        }
    }

    return NULL;
}